

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Block.cpp
# Opt level: O0

unique_ptr<ninx::parser::element::FunctionDefinition,_std::default_delete<ninx::parser::element::FunctionDefinition>_>
 build_size_definition(void)

{
  pointer this;
  __uniq_ptr_data<ninx::parser::element::FunctionDefinition,_std::default_delete<ninx::parser::element::FunctionDefinition>,_true,_true>
  in_RDI;
  anon_class_1_0_00000001 local_69;
  function<std::unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>_(ninx::parser::element::Block_*,_std::unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>)>
  local_68;
  unique_ptr<ninx::parser::element::FunctionDefinition,_std::default_delete<ninx::parser::element::FunctionDefinition>_>
  local_48;
  __single_object definition;
  unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_> body;
  vector<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
  arguments;
  
  std::
  vector<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
  ::vector((vector<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
            *)&body);
  ninx::parser::element::Block::make_empty((Block *)&stack0xffffffffffffffd0,(Block *)0x0);
  std::
  make_unique<ninx::parser::element::FunctionDefinition,char_const(&)[5],std::vector<std::unique_ptr<ninx::parser::element::FunctionArgument,std::default_delete<ninx::parser::element::FunctionArgument>>,std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,std::default_delete<ninx::parser::element::FunctionArgument>>>>,std::unique_ptr<ninx::parser::element::Block,std::default_delete<ninx::parser::element::Block>>>
            ((char (*) [5])&local_48,
             (vector<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
              *)"size",&body);
  this = std::
         unique_ptr<ninx::parser::element::FunctionDefinition,_std::default_delete<ninx::parser::element::FunctionDefinition>_>
         ::operator->(&local_48);
  std::
  function<std::unique_ptr<ninx::parser::element::Block,std::default_delete<ninx::parser::element::Block>>(ninx::parser::element::Block*,std::unique_ptr<ninx::parser::element::Block,std::default_delete<ninx::parser::element::Block>>)>
  ::function<build_size_definition()::__0,void>
            ((function<std::unique_ptr<ninx::parser::element::Block,std::default_delete<ninx::parser::element::Block>>(ninx::parser::element::Block*,std::unique_ptr<ninx::parser::element::Block,std::default_delete<ninx::parser::element::Block>>)>
              *)&local_68,&local_69);
  ninx::parser::element::FunctionDefinition::set_evaluator(this,&local_68);
  std::
  function<std::unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>_(ninx::parser::element::Block_*,_std::unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>)>
  ::~function(&local_68);
  std::
  unique_ptr<ninx::parser::element::FunctionDefinition,_std::default_delete<ninx::parser::element::FunctionDefinition>_>
  ::unique_ptr((unique_ptr<ninx::parser::element::FunctionDefinition,_std::default_delete<ninx::parser::element::FunctionDefinition>_>
                *)in_RDI.
                  super___uniq_ptr_impl<ninx::parser::element::FunctionDefinition,_std::default_delete<ninx::parser::element::FunctionDefinition>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_ninx::parser::element::FunctionDefinition_*,_std::default_delete<ninx::parser::element::FunctionDefinition>_>
                  .super__Head_base<0UL,_ninx::parser::element::FunctionDefinition_*,_false>.
                  _M_head_impl,&local_48);
  std::
  unique_ptr<ninx::parser::element::FunctionDefinition,_std::default_delete<ninx::parser::element::FunctionDefinition>_>
  ::~unique_ptr(&local_48);
  std::unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
  ::~unique_ptr((unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
                 *)&stack0xffffffffffffffd0);
  std::
  vector<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
  ::~vector((vector<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
             *)&body);
  return (__uniq_ptr_data<ninx::parser::element::FunctionDefinition,_std::default_delete<ninx::parser::element::FunctionDefinition>,_true,_true>
          )(tuple<ninx::parser::element::FunctionDefinition_*,_std::default_delete<ninx::parser::element::FunctionDefinition>_>
            )in_RDI.
             super___uniq_ptr_impl<ninx::parser::element::FunctionDefinition,_std::default_delete<ninx::parser::element::FunctionDefinition>_>
             ._M_t.
             super__Tuple_impl<0UL,_ninx::parser::element::FunctionDefinition_*,_std::default_delete<ninx::parser::element::FunctionDefinition>_>
             .super__Head_base<0UL,_ninx::parser::element::FunctionDefinition_*,_false>._M_head_impl
  ;
}

Assistant:

std::unique_ptr<ninx::parser::element::FunctionDefinition> build_size_definition() {
    std::vector<std::unique_ptr<ninx::parser::element::FunctionArgument>> arguments;
    auto body{ninx::parser::element::Block::make_empty(nullptr)};
    auto definition = std::make_unique<ninx::parser::element::FunctionDefinition>("size", std::move(arguments),
                                                                                  std::move(body));
    definition->set_evaluator(
            [](ninx::parser::element::Block *target, std::unique_ptr<ninx::parser::element::Block> args) {
                return ninx::parser::element::Block::make_text_block(target, boost::lexical_cast<std::string>(
                        target->get_children_count()));
            });
    return std::move(definition);
}